

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O1

CompressedStorage<double,_int> * __thiscall
Eigen::internal::CompressedStorage<double,_int>::operator=
          (CompressedStorage<double,_int> *this,CompressedStorage<double,_int> *other)

{
  resize(this,other->m_size,0.0);
  if (0 < other->m_size) {
    if (this->m_size != 0) {
      memcpy(this->m_values,other->m_values,this->m_size << 3);
    }
    if (this->m_size != 0) {
      memcpy(this->m_indices,other->m_indices,this->m_size << 2);
    }
  }
  return this;
}

Assistant:

CompressedStorage& operator=(const CompressedStorage& other)
    {
      resize(other.size());
      if(other.size()>0)
      {
        internal::smart_copy(other.m_values,  other.m_values  + m_size, m_values);
        internal::smart_copy(other.m_indices, other.m_indices + m_size, m_indices);
      }
      return *this;
    }